

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_NtkComputePathsR(Acb_Ntk_t *p,Vec_Int_t *vTfi,int fReverse)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  if ((p->vPathR).nSize < 1) {
    Vec_IntFill(&p->vPathR,(p->vObjType).nCap,0);
  }
  if (fReverse == 0) {
    for (iVar5 = 0; iVar5 < vTfi->nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(vTfi,iVar5);
      iVar2 = Acb_ObjIsCo(p,iVar1);
      iVar3 = Acb_ObjSlack(p,iVar1);
      if (iVar2 == 0) {
        if (iVar3 != 0) {
          uVar4 = 0;
          goto LAB_003162ce;
        }
        Acb_ObjComputePathR(p,iVar1);
      }
      else {
        uVar4 = (uint)(iVar3 == 0);
LAB_003162ce:
        Vec_IntWriteEntry(&p->vPathR,iVar1,uVar4);
      }
    }
  }
  else {
    iVar5 = vTfi->nSize;
    while (0 < iVar5) {
      iVar5 = iVar5 + -1;
      iVar1 = Vec_IntEntry(vTfi,iVar5);
      iVar2 = Acb_ObjIsCo(p,iVar1);
      iVar3 = Acb_ObjSlack(p,iVar1);
      if (iVar2 == 0) {
        if (iVar3 != 0) {
          uVar4 = 0;
          goto LAB_00316266;
        }
        Acb_ObjComputePathR(p,iVar1);
      }
      else {
        uVar4 = (uint)(iVar3 == 0);
LAB_00316266:
        Vec_IntWriteEntry(&p->vPathR,iVar1,uVar4);
      }
    }
  }
  iVar5 = 0;
  for (iVar1 = 0; iVar1 < (p->vCis).nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(&p->vCis,iVar1);
    iVar2 = Acb_ObjPathR(p,iVar2);
    iVar5 = iVar5 + iVar2;
  }
  p->nPaths = iVar5;
  return iVar5;
}

Assistant:

int Acb_NtkComputePathsR( Acb_Ntk_t * p, Vec_Int_t * vTfi, int fReverse )
{
    int i, iObj, Path = 0;
    if ( !Acb_NtkHasObjPathR( p ) )
        Acb_NtkCleanObjPathR( p );
    // it is assumed that vTfi contains CO nodes
    //assert( Acb_ObjSlack(p, Vec_IntEntry(vTfi, 0)) );
    if ( fReverse )
    {
        Vec_IntForEachEntryReverse( vTfi, iObj, i )
        {
            if ( Acb_ObjIsCo(p, iObj) )
                Acb_ObjSetPathR( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathR( p, iObj, 0 );
            else
                Acb_ObjComputePathR( p, iObj );
        }
    }
    else
    {
        Vec_IntForEachEntry( vTfi, iObj, i )
        {
            if ( Acb_ObjIsCo(p, iObj) )
                Acb_ObjSetPathR( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathR( p, iObj, 0 );
            else
                Acb_ObjComputePathR( p, iObj );
        }
    }
    Acb_NtkForEachCi( p, iObj, i )
        Path += Acb_ObjPathR(p, iObj);
//    assert( p->nPaths == Path );
    p->nPaths = Path;
    return Path;
}